

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

bool __thiscall
ON_SubDComponentFilter::AcceptComponent
          (ON_SubDComponentFilter *this,ON_COMPONENT_INDEX component_index,ON_Geometry *geometry)

{
  bool bVar1;
  Type TVar2;
  uint uVar3;
  ON_SubDComponentRef *this_00;
  ON_SubDComponentPtr cptr_00;
  ON_SubDComponentPtr cptr;
  ON_SubDComponentPtr local_28;
  ON_COMPONENT_INDEX local_20;
  
  local_20 = component_index;
  bVar1 = ON_COMPONENT_INDEX::IsSubDComponentIndex(&local_20);
  if (bVar1) {
    this_00 = ON_SubDComponentRef::Cast(&geometry->super_ON_Object);
    uVar3 = 0;
    if (this_00 == (ON_SubDComponentRef *)0x0) goto LAB_005f3b95;
    cptr_00 = ON_SubDComponentRef::ComponentPtr(this_00);
    if ((cptr_00.m_ptr & 0xfffffffffffffff8) != 0 && (cptr_00.m_ptr & 6) != 0) {
      uVar3 = *(uint *)((cptr_00.m_ptr & 0xfffffffffffffff8) + 8);
    }
    if (local_20.m_index == uVar3) {
      local_28 = cptr_00;
      if (local_20.m_type == subd_face) {
        TVar2 = ON_SubDComponentPtr::ComponentType(&local_28);
        if (TVar2 == Face) goto LAB_005f3b78;
      }
      else if (local_20.m_type == subd_edge) {
        TVar2 = ON_SubDComponentPtr::ComponentType(&local_28);
        if (TVar2 == Edge) goto LAB_005f3b78;
      }
      else if ((local_20.m_type != subd_vertex) ||
              (TVar2 = ON_SubDComponentPtr::ComponentType(&local_28), TVar2 == Vertex)) {
LAB_005f3b78:
        bVar1 = AcceptComponent(this,cptr_00);
        uVar3 = (uint)bVar1;
        goto LAB_005f3b95;
      }
    }
  }
  uVar3 = 0;
LAB_005f3b95:
  return SUB41(uVar3,0);
}

Assistant:

bool ON_SubDComponentFilter::AcceptComponent(ON_COMPONENT_INDEX component_index, const class ON_Geometry* geometry) const
{
  if (false == component_index.IsSubDComponentIndex())
    return false;
  const ON_SubDComponentRef* cref = ON_SubDComponentRef::Cast(geometry);
  if (nullptr == cref)
    return false;
  const ON_SubDComponentPtr cptr = cref->ComponentPtr();
  if (component_index.m_index != (int)cptr.ComponentId())
    return false;
  switch (component_index.m_type)
  {
  case ON_COMPONENT_INDEX::TYPE::subd_vertex:
    if (ON_SubDComponentPtr::Type::Vertex != cptr.ComponentType())
      return false;
    break;
  case ON_COMPONENT_INDEX::TYPE::subd_edge:
    if (ON_SubDComponentPtr::Type::Edge != cptr.ComponentType())
      return false;
    break;
  case ON_COMPONENT_INDEX::TYPE::subd_face:
    if (ON_SubDComponentPtr::Type::Face != cptr.ComponentType())
      return false;
    break;
  default: // 30 unhandled enum values
    break;
  }
  return AcceptComponent(cptr);
}